

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O0

int32 bio_writehdr(FILE *fp,...)

{
  char in_AL;
  size_t sVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  long *local_128;
  long *local_110;
  undefined1 local_f8 [8];
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  long local_48;
  char *val;
  uint local_38;
  uint32 b;
  va_list args;
  char *key;
  FILE *fp_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_f0 = in_RSI;
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  fprintf((FILE *)fp,"s3\n");
  args[0].overflow_arg_area = local_f8;
  args[0]._0_8_ = &stack0x00000008;
  b = 0x30;
  local_38 = 8;
  while( true ) {
    if (local_38 < 0x29) {
      local_110 = (long *)((long)(int)local_38 + (long)args[0].overflow_arg_area);
      local_38 = local_38 + 8;
    }
    else {
      local_110 = (long *)args[0]._0_8_;
      args[0]._0_8_ = args[0]._0_8_ + 8;
    }
    args[0].reg_save_area = (void *)*local_110;
    if (args[0].reg_save_area == (void *)0x0) {
      fprintf((FILE *)fp,"endhdr\n");
      fflush((FILE *)fp);
      val._4_4_ = 0x11223344;
      sVar1 = fwrite((void *)((long)&val + 4),4,1,(FILE *)fp);
      if (sVar1 != 1) {
        return -1;
      }
      fflush((FILE *)fp);
      return 0;
    }
    if (local_38 < 0x29) {
      local_128 = (long *)((long)(int)local_38 + (long)args[0].overflow_arg_area);
      local_38 = local_38 + 8;
    }
    else {
      local_128 = (long *)args[0]._0_8_;
      args[0]._0_8_ = args[0]._0_8_ + 8;
    }
    local_48 = *local_128;
    if (local_48 == 0) break;
    fprintf((FILE *)fp,"%s %s\n",args[0].reg_save_area,local_48);
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
          ,0xa6,"Wrong number of arguments\n");
  return -1;
}

Assistant:

int32
bio_writehdr(FILE *fp, ...)
{
    char const *key;
    va_list args;
    uint32 b;

    fprintf(fp, "s3\n");
    va_start(args, fp);
    while ((key = va_arg(args, char const *)) != NULL) {
        char const *val = va_arg(args, char const *);
        if (val == NULL) {
            E_ERROR("Wrong number of arguments\n");
            va_end(args);
            return -1;
        }
        fprintf(fp, "%s %s\n", key, val);
    }
    va_end(args);

    fprintf(fp, "endhdr\n");
    fflush(fp);

    b = (uint32) BYTE_ORDER_MAGIC;
    if (fwrite(&b, sizeof(uint32), 1, fp) != 1)
        return -1;
    fflush(fp);

    return 0;
}